

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 CalcWindowContentSize(ImGuiWindow *window)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar3;
  
  if ((((window->Collapsed != true) || (0 < window->AutoFitFramesX)) || (0 < window->AutoFitFramesY)
      ) && (((window->Hidden != true || (window->HiddenFramesCannotSkipItems != 0)) ||
            (window->HiddenFramesCanSkipItems < 1)))) {
    fVar2 = (window->ContentSizeExplicit).x;
    if ((fVar2 == 0.0) && (!NAN(fVar2))) {
      fVar2 = (window->DC).CursorMaxPos.x - (window->DC).CursorStartPos.x;
    }
    fVar3 = (window->ContentSizeExplicit).y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      fVar3 = (window->DC).CursorMaxPos.y - (window->DC).CursorStartPos.y;
    }
    IVar1.y = (float)(int)fVar3;
    IVar1.x = (float)(int)fVar2;
    return IVar1;
  }
  return window->ContentSize;
}

Assistant:

static ImVec2 CalcWindowContentSize(ImGuiWindow* window)
{
    if (window->Collapsed)
        if (window->AutoFitFramesX <= 0 && window->AutoFitFramesY <= 0)
            return window->ContentSize;
    if (window->Hidden && window->HiddenFramesCannotSkipItems == 0 && window->HiddenFramesCanSkipItems > 0)
        return window->ContentSize;

    ImVec2 sz;
    sz.x = (float)(int)((window->ContentSizeExplicit.x != 0.0f) ? window->ContentSizeExplicit.x : window->DC.CursorMaxPos.x - window->DC.CursorStartPos.x);
    sz.y = (float)(int)((window->ContentSizeExplicit.y != 0.0f) ? window->ContentSizeExplicit.y : window->DC.CursorMaxPos.y - window->DC.CursorStartPos.y);
    return sz;
}